

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_graph.cpp
# Opt level: O2

int __thiscall Clasp::AcyclicityCheck::init(AcyclicityCheck *this,EVP_PKEY_CTX *ctx)

{
  size_type n;
  DependencyGraph *pDVar1;
  SolverParams *p;
  long *plVar2;
  Parent local_18;
  
  pDVar1 = this->graph_;
  if (pDVar1 == (DependencyGraph *)0x0) {
    pDVar1 = (DependencyGraph *)(*(ulong *)(*(long *)(ctx + 0x68) + 0x10) & 0xfffffffffffffffe);
    this->graph_ = pDVar1;
    if (pDVar1 == (DependencyGraph *)0x0) goto LAB_001307f5;
  }
  if ((this->strat_ & 4) != 0) {
    plVar2 = (long *)(*(ulong *)(*(long *)(ctx + 0x68) + 0xe0) & 0xfffffffffffffffe);
    p = (SolverParams *)(**(code **)(*plVar2 + 0x30))(plVar2,*(ulong *)(ctx + 0x70) >> 0x3a);
    setStrategy(this,p);
    pDVar1 = this->graph_;
  }
  n = pDVar1->maxNode_;
  this->tagCnt_ = 0;
  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::assign
            (&this->tags_,n,&this->tagCnt_);
  local_18.lit.rep_ = 0;
  local_18.node = 0;
  bk_lib::
  pod_vector<Clasp::AcyclicityCheck::Parent,_std::allocator<Clasp::AcyclicityCheck::Parent>_>::
  resize(&this->parent_,this->graph_->maxNode_,&local_18);
  (this->todo_).vec.ebo_.size = 0;
  (this->todo_).qFront = 0;
  this->solver_ = (Solver *)ctx;
  pDVar1 = (DependencyGraph *)
           ExtDepGraph::attach(this->graph_,(Solver *)ctx,(Constraint *)this,this->genId_);
  this->genId_ = (uint64)pDVar1;
LAB_001307f5:
  return (int)CONCAT71((int7)((ulong)pDVar1 >> 8),1);
}

Assistant:

bool AcyclicityCheck::init(Solver& s) {
	if (!graph_) { graph_ = s.sharedContext()->extGraph.get(); }
	if (!graph_) { return true; }
	if (test_bit(strat_, config_bit)) {
		setStrategy(s.sharedContext()->configuration()->solver(s.id()));
	}
	tags_.assign(graph_->nodes(), tagCnt_ = 0);
	parent_.resize(graph_->nodes());
	todo_.clear();
	solver_ = &s;
	genId_  = graph_->attach(s, *this, genId_);
	return true;
}